

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

void __thiscall CaptureSummary::~CaptureSummary(CaptureSummary *this)

{
  pointer pp_Var1;
  _capture_line *p_Var2;
  size_t i;
  ulong uVar3;
  
  for (uVar3 = 0;
      pp_Var1 = (this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->summary).
                            super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3);
      uVar3 = uVar3 + 1) {
    p_Var2 = pp_Var1[uVar3];
    if (p_Var2 != (_capture_line *)0x0) {
      operator_delete(p_Var2);
      (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (_capture_line *)0x0;
    }
  }
  std::_Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>::~_Vector_base
            (&(this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>)
  ;
  return;
}

Assistant:

CaptureSummary::~CaptureSummary()
{
    for (size_t i = 0; i < summary.size(); i++)
    {
        if (summary[i] != NULL)
        {
            delete summary[i];
            summary[i] = NULL;
        }
    }
}